

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void __thiscall icu_63::NFRule::~NFRule(NFRule *this)

{
  NFRule *this_local;
  
  if (this->sub1 != this->sub2) {
    if (this->sub2 != (NFSubstitution *)0x0) {
      (*(this->sub2->super_UObject)._vptr_UObject[1])();
    }
    this->sub2 = (NFSubstitution *)0x0;
  }
  if (this->sub1 != (NFSubstitution *)0x0) {
    (*(this->sub1->super_UObject)._vptr_UObject[1])();
  }
  this->sub1 = (NFSubstitution *)0x0;
  if (this->rulePatternFormat != (PluralFormat *)0x0) {
    (*(this->rulePatternFormat->super_Format).super_UObject._vptr_UObject[1])();
  }
  this->rulePatternFormat = (PluralFormat *)0x0;
  UnicodeString::~UnicodeString(&this->fRuleText);
  return;
}

Assistant:

NFRule::~NFRule()
{
    if (sub1 != sub2) {
        delete sub2;
        sub2 = NULL;
    }
    delete sub1;
    sub1 = NULL;
    delete rulePatternFormat;
    rulePatternFormat = NULL;
}